

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ClassPropertyDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClassPropertyDeclarationSyntax,slang::syntax::ClassPropertyDeclarationSyntax_const&>
          (BumpAllocator *this,ClassPropertyDeclarationSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  ClassPropertyDeclarationSyntax *pCVar4;
  
  pCVar4 = (ClassPropertyDeclarationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8)
  ;
  if ((ClassPropertyDeclarationSyntax *)this->endPtr < pCVar4 + 1) {
    pCVar4 = (ClassPropertyDeclarationSyntax *)allocateSlow(this,0x90,8);
  }
  else {
    this->head->current = (byte *)(pCVar4 + 1);
  }
  (pCVar4->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar3 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pCVar4->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar4->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar3;
  (pCVar4->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar3 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar4->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pCVar4->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (pCVar4->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar4->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pCVar4->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002f8690;
  (pCVar4->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pCVar4->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pCVar4->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pCVar4->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_002f85e0;
  uVar3 = *(undefined4 *)&(args->qualifiers).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->qualifiers).super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar4->qualifiers).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->qualifiers).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar4->qualifiers).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (pCVar4->qualifiers).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar4->qualifiers).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->qualifiers).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pCVar4->qualifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002f8690;
  (pCVar4->qualifiers).super_SyntaxListBase.childCount =
       (args->qualifiers).super_SyntaxListBase.childCount;
  sVar2 = (args->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pCVar4->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
       (args->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr;
  (pCVar4->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pCVar4->qualifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_002f8be0;
  (pCVar4->declaration).ptr = (args->declaration).ptr;
  return pCVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }